

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_0::MemoryAllocator::allocatePBuffer(MemoryAllocator *this)

{
  Random *rnd;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> first;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> last;
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  Library *pLVar4;
  undefined4 extraout_var;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  EGLSurface surface;
  EGLint attribList [5];
  value_type local_50;
  undefined4 local_48;
  int local_44;
  undefined4 local_40;
  int local_3c;
  undefined4 local_38;
  
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            (&this->m_pbuffers,
             ((long)(this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pLVar4 = EglTestContext::getLibrary(this->m_eglTestCtx);
  rnd = &this->m_rnd;
  iVar1 = de::Random::getInt(rnd,this->m_minWidth,this->m_maxWidth);
  local_3c = de::Random::getInt(rnd,this->m_minHeight,this->m_maxHeight);
  local_48 = 0x3057;
  local_40 = 0x3056;
  local_38 = 0x3038;
  local_44 = iVar1;
  iVar1 = (*pLVar4->_vptr_Library[10])(pLVar4,this->m_display,this->m_config);
  local_50 = (value_type)CONCAT44(extraout_var,iVar1);
  dVar2 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  eglu::checkError(dVar2,"eglCreatePbufferSurface",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0xd2);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_pbuffers,&local_50);
  if (this->m_use == true) {
    first._M_current =
         (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    last._M_current =
         (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (last._M_current != first._M_current) {
      pvVar5 = de::Random::
               choose<void*,__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
                         (rnd,first,last);
      fVar6 = deRandom_getFloat(&rnd->m_rnd);
      fVar7 = deRandom_getFloat(&rnd->m_rnd);
      fVar8 = deRandom_getFloat(&rnd->m_rnd);
      fVar9 = deRandom_getFloat(&rnd->m_rnd);
      (*pLVar4->_vptr_Library[0x27])(pLVar4,this->m_display,local_50,local_50,pvVar5);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar2,"makeCurrent(m_display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0xe0);
      (*(this->m_gl).clearColor)(fVar6,fVar7,fVar8,fVar9);
      GVar3 = (*(this->m_gl).getError)();
      glu::checkError(GVar3,"glClearColor()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0xe3);
      (*(this->m_gl).clear)(0x4000);
      GVar3 = (*(this->m_gl).getError)();
      glu::checkError(GVar3,"glClear()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0xe6);
      (*pLVar4->_vptr_Library[0x27])(pLVar4,this->m_display,0,0,0);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar2,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0xe8);
    }
  }
  return;
}

Assistant:

void MemoryAllocator::allocatePBuffer (void)
{
	// Reserve space for new allocations
	try
	{
		m_pbuffers.reserve(m_pbuffers.size() + 1);
	}
	catch (const std::bad_alloc&)
	{
		m_errorString	= "std::bad_alloc when allocating more space for testcase. Out of host memory.";
		m_failed		= true;
		return;
	}

	// Allocate pbuffer
	try
	{
		const Library&	egl				= m_eglTestCtx.getLibrary();
		const EGLint	width			= m_rnd.getInt(m_minWidth, m_maxWidth);
		const EGLint	height			= m_rnd.getInt(m_minHeight, m_maxHeight);
		const EGLint	attribList[]	=
		{
			EGL_WIDTH,	width,
			EGL_HEIGHT, height,
			EGL_NONE
		};

		EGLSurface		surface			= egl.createPbufferSurface(m_display, m_config, attribList);
		EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface");

		DE_ASSERT(surface != EGL_NO_SURFACE);

		m_pbuffers.push_back(surface);

		if (m_use && m_contexts.size() > 0)
		{
			EGLContext				context		= m_rnd.choose<EGLContext>(m_contexts.begin(), m_contexts.end());
			const float				red			= m_rnd.getFloat();
			const float				green		= m_rnd.getFloat();
			const float				blue		= m_rnd.getFloat();
			const float				alpha		= m_rnd.getFloat();

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, context));

			m_gl.clearColor(red, green, blue, alpha);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearColor()");

			m_gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClear()");

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		}
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_ALLOC)
		{
			m_errorString	= "eglCreatePbufferSurface returned EGL_BAD_ALLOC";
			m_failed		= true;
			return;
		}
		else
			throw;
	}
}